

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

Time * Time::fromLocal(Time *__return_storage_ptr__,LocalTime *time)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  
  _Var1 = (time->super_Time).timeSinceEpoch.tv_sec;
  _Var2 = (time->super_Time).timeSinceEpoch.tv_usec;
  __return_storage_ptr__->_vptr_Time = (_func_int **)&PTR_getAsDate_0012e790;
  (__return_storage_ptr__->timeSinceEpoch).tv_sec = _Var1;
  (__return_storage_ptr__->timeSinceEpoch).tv_usec = (ulong)(uint)_Var2;
  return __return_storage_ptr__;
}

Assistant:

Time fromLocal(const LocalTime & time)
    {
/*
        struct tm tmt;
        // The LocalTime class store its time as number of second since Epoch + (unknown) local offset.
        makeUTCTime((time_t)time.Second(), tmt);
        tmt.tm_isdst = -1; // Force detection of the DST rule in place at that time
        return Time(makeTime(&tmt), time.microSecond());
        */
        return Time(time.Second(), time.microSecond());
    }